

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  
  lVar5 = (long)end - (long)ptr;
  if (lVar5 < 2) {
    return -1;
  }
  bVar1 = ptr[1];
  if (bVar1 < 0xdc) {
    bVar3 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        bVar3 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      }
      else {
LAB_00446426:
        bVar3 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    bVar3 = 8;
  }
  else {
    if ((bVar1 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_00446426;
    bVar3 = 0;
  }
  iVar4 = 0;
  if (bVar3 < 0x15) {
    if (1 < bVar3 - 9) {
      if (bVar3 == 6) {
        if (lVar5 == 2) {
          return -2;
        }
      }
      else if ((bVar3 == 7) && (lVar5 < 4)) {
        return -2;
      }
      goto switchD_00446456_caseD_17;
    }
switchD_00446456_caseD_15:
    iVar4 = 0x16;
  }
  else {
    switch(bVar3) {
    case 0x15:
    case 0x1e:
      goto switchD_00446456_caseD_15;
    case 0x16:
    case 0x18:
switchD_00446456_caseD_16:
      ptr = ptr + 2;
      lVar5 = (long)end - (long)ptr;
      if (lVar5 < 2) {
        return -1;
      }
      do {
        bVar1 = ((byte *)ptr)[1];
        if (bVar1 < 0xdc) {
          cVar2 = '\a';
          if (3 < bVar1 - 0xd8) {
            if (bVar1 == 0) {
              cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
            }
            else {
LAB_00446505:
              cVar2 = '\x1d';
            }
          }
        }
        else if (bVar1 - 0xdc < 4) {
          cVar2 = '\b';
        }
        else {
          if ((bVar1 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_00446505;
          cVar2 = '\0';
        }
        switch(cVar2) {
        case '\x12':
          ptr = (char *)((byte *)ptr + 2);
          iVar4 = 0x1c;
        case '\x13':
        case '\x14':
        case '\x15':
        case '\x17':
        case '\x1c':
          goto switchD_00446456_caseD_17;
        case '\x1d':
          if ((*(uint *)((long)namingBitmap +
                        (ulong)((byte)*ptr >> 3 & 0x1c |
                               (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
               ((byte)*ptr & 0x1f) & 1) == 0) goto switchD_00446456_caseD_17;
        case '\x16':
        case '\x18':
        case '\x19':
        case '\x1a':
        case '\x1b':
          ptr = (char *)((byte *)ptr + 2);
          lVar5 = lVar5 + -2;
          if (lVar5 < 2) {
            return -1;
          }
          break;
        default:
          if (cVar2 == '\x06') {
            if (lVar5 == 2) {
              return -2;
            }
          }
          else if ((cVar2 == '\a') && (lVar5 < 4)) {
            return -2;
          }
          goto switchD_00446456_caseD_17;
        }
      } while( true );
    case 0x1d:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)((byte)*ptr >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5))
           >> ((byte)*ptr & 0x1f) & 1) != 0) goto switchD_00446456_caseD_16;
    }
  }
switchD_00446456_caseD_17:
  *nextTokPtr = ptr;
  return iVar4;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S: case BT_LF: case BT_CR: case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}